

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O0

void Ptex::v2_4::(anonymous_namespace)::Apply<float,1>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  int iVar1;
  int iVar2;
  int iVar3;
  VecMult<float,_1> *pVVar4;
  VecMult<float,_1> *this;
  float *in_RDX;
  Res *in_RDI;
  float *pRowEnd;
  float *kup;
  float *pEnd;
  float *p;
  float *kvp;
  int rowskip;
  int datalen;
  int rowlen;
  float *rowResult;
  float weight;
  float *in_stack_ffffffffffffff98;
  VecMult<float,_1> *local_48;
  
  iVar2 = Res::u(in_RDI);
  iVar1 = *(int *)(in_RDI + 6);
  weight = *(float *)(in_RDI + 4);
  iVar3 = Res::u(in_RDI);
  local_48 = (VecMult<float,_1> *)(in_RDX + ((int)weight * iVar3 + *(int *)(in_RDI + 2)));
  pVVar4 = local_48 + (long)(*(int *)(in_RDI + 8) * iVar2) * 4;
  for (; local_48 != pVVar4; local_48 = local_48 + (long)(iVar2 - iVar1) * 4) {
    this = local_48 + (long)iVar1 * 4;
    PtexUtils::VecMult<float,_1>::VecMult((VecMult<float,_1> *)&stack0xffffffffffffff9f);
    PtexUtils::VecMult<float,_1>::operator()(this,in_stack_ffffffffffffff98,in_RDX,weight);
    while (local_48 = local_48 + 4, local_48 != this) {
      PtexUtils::VecAccum<float,_1>::VecAccum((VecAccum<float,_1> *)&stack0xffffffffffffff9e);
      PtexUtils::VecAccum<float,_1>::operator()
                ((VecAccum<float,_1> *)this,in_stack_ffffffffffffff98,in_RDX,weight);
    }
    PtexUtils::VecAccum<float,_1>::VecAccum((VecAccum<float,_1> *)&stack0xffffffffffffff9d);
    PtexUtils::VecAccum<float,_1>::operator()
              ((VecAccum<float,_1> *)this,in_stack_ffffffffffffff98,in_RDX,weight);
  }
  return;
}

Assistant:

void Apply(PtexSeparableKernel& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nChan;
        int datalen = k.uw * nChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMult<T,nChan>()(rowResult, p, *kup++);
            p += nChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccum<T,nChan>()(rowResult, p, *kup++);
                p += nChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccum<float,nChan>()(result, rowResult, *kvp++);
            p += rowskip;
        }
    }